

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeRemoveWindow(ImGuiDockNode *node,ImGuiWindow *window,ImGuiID save_dock_id)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *ctx;
  int iVar2;
  ImGuiWindow **ppIVar3;
  bool bVar4;
  ImGuiWindow *remaining_window;
  int local_30;
  int tab_count_threshold_for_tab_bar;
  int n;
  bool erased;
  ImGuiContext *g;
  ImGuiID save_dock_id_local;
  ImGuiWindow *window_local;
  ImGuiDockNode *node_local;
  
  ctx = GImGui;
  if (window->DockNode != node) {
    __assert_fail("window->DockNode == node",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3156,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  bVar4 = true;
  if (save_dock_id != 0) {
    bVar4 = save_dock_id == node->ID;
  }
  if (!bVar4) {
    __assert_fail("save_dock_id == 0 || save_dock_id == node->ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3159,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  window->DockNode = (ImGuiDockNode *)0x0;
  window->field_0x492 = window->field_0x492 & 0xfb;
  window->field_0x492 = window->field_0x492 & 0xfe;
  window->DockId = save_dock_id;
  UpdateWindowParentAndRootLinks(window,window->Flags & 0xfeffffff,(ImGuiWindow *)0x0);
  bVar4 = false;
  local_30 = 0;
  do {
    if ((node->Windows).Size <= local_30) {
LAB_00153679:
      if (!bVar4) {
        __assert_fail("erased",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x316a,
                      "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
      }
      if (node->VisibleWindow == window) {
        node->VisibleWindow = (ImGuiWindow *)0x0;
      }
      node->field_0xba = node->field_0xba & 0xfd | 2;
      if (node->TabBar != (ImGuiTabBar *)0x0) {
        TabBarRemoveTab(node->TabBar,window->ID);
        bVar4 = ImGuiDockNode::IsCentralNode(node);
        iVar2 = 2;
        if (bVar4) {
          iVar2 = 1;
        }
        if ((node->Windows).Size < iVar2) {
          DockNodeRemoveTabBar(node);
        }
      }
      if (((((node->Windows).Size != 0) || (bVar4 = ImGuiDockNode::IsCentralNode(node), bVar4)) ||
          (bVar4 = ImGuiDockNode::IsDockSpace(node), bVar4)) || (window->DockId == node->ID)) {
        if ((((node->Windows).Size == 1) && (bVar4 = ImGuiDockNode::IsCentralNode(node), !bVar4)) &&
           (node->HostWindow != (ImGuiWindow *)0x0)) {
          ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,0);
          pIVar1 = *ppIVar3;
          if (((node->HostWindow->ViewportOwned & 1U) != 0) &&
             (bVar4 = ImGuiDockNode::IsRootNode(node), bVar4)) {
            if (node->HostWindow->Viewport->Window != node->HostWindow) {
              __assert_fail("node->HostWindow->Viewport->Window == node->HostWindow",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                            ,0x3185,
                            "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)"
                           );
            }
            node->HostWindow->Viewport->Window = pIVar1;
            (node->HostWindow->Viewport->super_ImGuiViewport).ID = pIVar1->ID;
          }
          pIVar1->Collapsed = (bool)(node->HostWindow->Collapsed & 1);
        }
        DockNodeUpdateVisibleFlag(node);
      }
      else {
        DockContextRemoveNode(ctx,node,true);
      }
      return;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,local_30);
    if (*ppIVar3 == window) {
      ImVector<ImGuiWindow_*>::erase(&node->Windows,(node->Windows).Data + local_30);
      bVar4 = true;
      goto LAB_00153679;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static void ImGui::DockNodeRemoveWindow(ImGuiDockNode* node, ImGuiWindow* window, ImGuiID save_dock_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window->DockNode == node);
    //IM_ASSERT(window->RootWindow == node->HostWindow);
    //IM_ASSERT(window->LastFrameActive < g.FrameCount);    // We may call this from Begin()
    IM_ASSERT(save_dock_id == 0 || save_dock_id == node->ID);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeRemoveWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    window->DockNode = NULL;
    window->DockIsActive = window->DockTabWantClose = false;
    window->DockId = save_dock_id;
    UpdateWindowParentAndRootLinks(window, window->Flags & ~ImGuiWindowFlags_ChildWindow, NULL); // Update immediately

    // Remove window
    bool erased = false;
    for (int n = 0; n < node->Windows.Size; n++)
        if (node->Windows[n] == window)
        {
            node->Windows.erase(node->Windows.Data + n);
            erased = true;
            break;
        }
    IM_ASSERT(erased);
    if (node->VisibleWindow == window)
        node->VisibleWindow = NULL;

    // Remove tab and possibly tab bar
    node->WantHiddenTabBarUpdate = true;
    if (node->TabBar)
    {
        TabBarRemoveTab(node->TabBar, window->ID);
        const int tab_count_threshold_for_tab_bar = node->IsCentralNode() ? 1 : 2;
        if (node->Windows.Size < tab_count_threshold_for_tab_bar)
            DockNodeRemoveTabBar(node);
    }

    if (node->Windows.Size == 0 && !node->IsCentralNode() && !node->IsDockSpace() && window->DockId != node->ID)
    {
        // Automatic dock node delete themselves if they are not holding at least one tab
        DockContextRemoveNode(&g, node, true);
        return;
    }

    if (node->Windows.Size == 1 && !node->IsCentralNode() && node->HostWindow)
    {
        ImGuiWindow* remaining_window = node->Windows[0];
        if (node->HostWindow->ViewportOwned && node->IsRootNode())
        {
            // Transfer viewport back to the remaining loose window
            IM_ASSERT(node->HostWindow->Viewport->Window == node->HostWindow);
            node->HostWindow->Viewport->Window = remaining_window;
            node->HostWindow->Viewport->ID = remaining_window->ID;
        }
        remaining_window->Collapsed = node->HostWindow->Collapsed;
    }

    // Update visibility immediately is required so the DockNodeUpdateRemoveInactiveChilds() processing can reflect changes up the tree
    DockNodeUpdateVisibleFlag(node);
}